

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<std::array<double,4ul>,double>
               (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *src,
               vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,double eps)

{
  double *pdVar1;
  double *pdVar2;
  pointer paVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  pointer puVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  __node_base _Var9;
  uint uVar10;
  size_type __new_size;
  long lVar11;
  bool bVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint32_t vidx;
  unordered_map<unsigned_int,_std::array<double,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>_>
  vdata;
  uint local_8c;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *local_88;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *local_80;
  double local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x0) {
    bVar13 = false;
  }
  else {
    uVar5 = (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(faceVertexIndices->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    bVar13 = false;
    if (((long)(src->
               super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(src->
               super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5 == uVar5) && (2 < uVar5)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      puVar6 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar13 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish == puVar6;
      if (bVar13) {
        __new_size = 1;
      }
      else {
        lVar11 = 0;
        uVar5 = 0;
        uVar10 = 0;
        local_88 = src;
        local_80 = dst;
        local_78 = eps;
        local_70 = faceVertexIndices;
        do {
          local_8c = puVar6[uVar5];
          if (uVar10 < local_8c) {
            uVar10 = local_8c;
          }
          sVar7 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&local_68,&local_8c);
          if (sVar7 == 0) {
            paVar3 = (local_88->
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pmVar8 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_8c);
            pdVar2 = (double *)((long)paVar3->_M_elems + lVar11);
            dVar14 = pdVar2[1];
            pdVar1 = (double *)((long)paVar3->_M_elems + lVar11 + 0x10);
            dVar17 = *pdVar1;
            dVar15 = pdVar1[1];
            pmVar8->_M_elems[0] = *pdVar2;
            pmVar8->_M_elems[1] = dVar14;
            pmVar8->_M_elems[2] = dVar17;
            pmVar8->_M_elems[3] = dVar15;
          }
          else {
            pmVar8 = ::std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_68,&local_8c);
            paVar3 = (local_88->
                     super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            dVar14 = *(double *)((long)paVar3->_M_elems + lVar11);
            dVar17 = ABS(pmVar8->_M_elems[0] - dVar14);
            if (local_78 < dVar17) {
              dVar16 = ABS(pmVar8->_M_elems[0]);
              dVar14 = ABS(dVar14);
              dVar15 = dVar14;
              if (dVar14 <= dVar16) {
                dVar15 = dVar16;
              }
              if ((double)(~-(ulong)NAN(dVar16) & (ulong)dVar15 |
                          -(ulong)NAN(dVar16) & (ulong)dVar14) * local_78 < dVar17)
              goto LAB_00389b69;
            }
            dVar14 = *(double *)((long)paVar3->_M_elems + lVar11 + 8);
            dVar17 = ABS(pmVar8->_M_elems[1] - dVar14);
            if (local_78 < dVar17) {
              dVar16 = ABS(pmVar8->_M_elems[1]);
              dVar14 = ABS(dVar14);
              dVar15 = dVar14;
              if (dVar14 <= dVar16) {
                dVar15 = dVar16;
              }
              if ((double)(~-(ulong)NAN(dVar16) & (ulong)dVar15 |
                          -(ulong)NAN(dVar16) & (ulong)dVar14) * local_78 < dVar17)
              goto LAB_00389b69;
            }
            dVar14 = *(double *)((long)paVar3->_M_elems + lVar11 + 0x10);
            dVar17 = ABS(pmVar8->_M_elems[2] - dVar14);
            if (local_78 < dVar17) {
              dVar16 = ABS(pmVar8->_M_elems[2]);
              dVar14 = ABS(dVar14);
              dVar15 = dVar14;
              if (dVar14 <= dVar16) {
                dVar15 = dVar16;
              }
              if ((double)(~-(ulong)NAN(dVar16) & (ulong)dVar15 |
                          -(ulong)NAN(dVar16) & (ulong)dVar14) * local_78 < dVar17)
              goto LAB_00389b69;
            }
            dVar14 = *(double *)((long)paVar3->_M_elems + lVar11 + 0x18);
            dVar17 = ABS(pmVar8->_M_elems[3] - dVar14);
            if (local_78 < dVar17) {
              dVar16 = ABS(pmVar8->_M_elems[3]);
              dVar14 = ABS(dVar14);
              dVar15 = dVar14;
              if (dVar14 <= dVar16) {
                dVar15 = dVar16;
              }
              if ((double)(~-(ulong)NAN(dVar16) & (ulong)dVar15 |
                          -(ulong)NAN(dVar16) & (ulong)dVar14) * local_78 < dVar17)
              goto LAB_00389b69;
            }
          }
          uVar5 = uVar5 + 1;
          puVar6 = (local_70->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x20;
          bVar12 = uVar5 < (ulong)((long)(local_70->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6
                                  >> 2);
          bVar13 = !bVar12;
        } while (bVar12);
        __new_size = (size_type)(uVar10 + 1);
        dst = local_80;
      }
      ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::resize
                (dst,__new_size);
      memset((dst->
             super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)
             ._M_impl.super__Vector_impl_data._M_start,0,__new_size << 5);
      for (_Var9._M_nxt = local_68._M_before_begin._M_nxt; _Var9._M_nxt != (_Hash_node_base *)0x0;
          _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
        uVar10 = *(uint *)&_Var9._M_nxt[1]._M_nxt;
        paVar3 = (dst->
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        p_Var4 = _Var9._M_nxt[5]._M_nxt;
        pdVar1 = paVar3[uVar10]._M_elems + 2;
        *pdVar1 = (double)_Var9._M_nxt[4]._M_nxt;
        pdVar1[1] = (double)p_Var4;
        p_Var4 = _Var9._M_nxt[3]._M_nxt;
        paVar3 = paVar3 + uVar10;
        paVar3->_M_elems[0] = (double)_Var9._M_nxt[2]._M_nxt;
        paVar3->_M_elems[1] = (double)p_Var4;
      }
LAB_00389b69:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar13;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}